

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_RollbackAfterFillingRegion_Test::TestBody
          (Transaction_RollbackAfterFillingRegion_Test *this)

{
  mock_database *db;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var4;
  mock_mutex mutex;
  unique_lock<mock_mutex> local_80;
  AssertHelper local_70;
  uint64_t original_size;
  transaction<std::unique_lock<mock_mutex>_> t1;
  size_t original_num_regions;
  
  db = &(this->super_Transaction).db_;
  peVar1 = (this->super_Transaction).db_.super_database.storage_.file_.
           super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  original_num_regions =
       (long)(this->super_Transaction).db_.super_database.storage_.regions_.
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->super_Transaction).db_.super_database.storage_.regions_.
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::unique_lock<mock_mutex>::unique_lock(&local_80,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,&db->super_database,&local_80)
  ;
  std::unique_lock<mock_mutex>::~unique_lock(&local_80);
  peVar2 = (this->super_Transaction).db_.super_database.storage_.regions_.
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pstore::transaction_base::allocate
            (&t1.super_transaction_base,
             ((peVar2->offset_ + peVar2->size_) -
             (this->super_Transaction).db_.super_database.size_.logical_) - 0x70,1);
  pstore::transaction_base::commit(&t1.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  local_80._M_device =
       (mutex_type *)
       ((long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&t1,"regions.size ()","original_num_regions",(unsigned_long *)&local_80,
             &original_num_regions);
  if ((char)t1.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)(local_80._M_device + 0x10),
                    "Expected the first allocate to fill the initial region");
    if (t1.super_transaction_base.db_ == (database *)0x0) {
      pp_Var4 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var4 = (t1.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&original_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x177,(char *)pp_Var4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&original_size,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&original_size);
    if (local_80._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_80._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&t1.super_transaction_base.db_);
  iVar3 = (*peVar1->_vptr_file_base[9])(peVar1);
  original_size = CONCAT44(extraout_var,iVar3);
  std::unique_lock<mock_mutex>::unique_lock(&local_80,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,&db->super_database,&local_80)
  ;
  std::unique_lock<mock_mutex>::~unique_lock(&local_80);
  pstore::transaction_base::allocate(&t1.super_transaction_base,4,1);
  pstore::transaction_base::rollback(&t1.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  local_80._M_device =
       (mutex_type *)
       ((long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&t1,"regions.size ()","original_num_regions",(unsigned_long *)&local_80,
             &original_num_regions);
  if ((char)t1.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)(local_80._M_device + 0x10),"Rollback did not reclaim regions");
    if (t1.super_transaction_base.db_ == (database *)0x0) {
      pp_Var4 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var4 = (t1.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x180,(char *)pp_Var4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_80._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&t1.super_transaction_base.db_);
  iVar3 = (*peVar1->_vptr_file_base[9])(peVar1);
  local_80._M_device = (mutex_type *)CONCAT44(extraout_var_00,iVar3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&t1,"file->size ()","original_size",(unsigned_long *)&local_80,
             &original_size);
  if ((char)t1.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)(local_80._M_device + 0x10),
                    "The file was not restored to its original size");
    if (t1.super_transaction_base.db_ == (database *)0x0) {
      pp_Var4 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var4 = (t1.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x181,(char *)pp_Var4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_80._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&t1.super_transaction_base.db_);
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterFillingRegion) {
    pstore::storage::region_container const & regions = db_.storage ().regions ();
    pstore::file::file_base * const file = db_.storage ().file ();
    std::size_t const original_num_regions = regions.size ();
    constexpr auto align = 1U;

    mock_mutex mutex;
    using guard_type = std::unique_lock<mock_mutex>;

    {
        auto t1 = begin (db_, guard_type{mutex});
        t1.allocate (regions.back ()->end () - db_.size () - sizeof (pstore::trailer), align);
        t1.commit ();
    }
    EXPECT_EQ (regions.size (), original_num_regions)
        << "Expected the first allocate to fill the initial region";

    std::uint64_t const original_size = file->size ();
    {
        auto t2 = begin (db_, guard_type{mutex});
        t2.allocate (sizeof (int), align);
        t2.rollback ();
    }
    EXPECT_EQ (regions.size (), original_num_regions) << "Rollback did not reclaim regions";
    EXPECT_EQ (file->size (), original_size) << "The file was not restored to its original size";
}